

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O3

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::destroy_cocycle(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
                  *this,Simplex_handle *sigma,A_ds_type *a_ds,Simplex_key death_key,
                 Arith_element inv_x,Arith_element charac)

{
  Col_type *this_00;
  Filtration_value *pFVar1;
  Cam *value;
  Persistent_cohomology_column<unsigned_int,_int> *pPVar2;
  Column *target;
  undefined8 *puVar3;
  long lVar4;
  long *plVar5;
  undefined1 *puVar6;
  node_ptr plVar7;
  uint *puVar8;
  int *piVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  anon_class_8_1_8991fb9c aVar12;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>,std::_Select1st<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
  *this_01;
  uint uVar13;
  Element w;
  node_ptr to_erase;
  _Base_ptr p_Var14;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  Filtration_value *pFVar17;
  char *__function;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  iterator __position;
  ulong uVar21;
  Filtration_value *pFVar22;
  uint uVar23;
  bool bVar24;
  float fVar25;
  Arith_element local_a4;
  anon_class_8_1_8991fb9c local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  Arith_element local_84;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>,std::_Select1st<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
  *local_80;
  Column *local_78;
  undefined1 local_70 [40];
  Field_Zp *local_48;
  Column *local_40;
  node_ptr local_38;
  
  pFVar22 = (Filtration_value *)&sigma->m_ptr->second;
  if (sigma->m_ptr ==
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
       *)0x0) {
    pFVar22 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  pPVar2 = (Persistent_cohomology_column<unsigned_int,_int> *)
           (this->cpx_->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start[death_key].m_ptr;
  pFVar17 = (Filtration_value *)
            ((long)&pPVar2->
                    super_set_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)0>_>
            + 8);
  if (pPVar2 == (Persistent_cohomology_column<unsigned_int,_int> *)0x0) {
    pFVar17 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  fVar25 = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *)pFVar22)->super_Filtration_simplex_base).filt_ -
           (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *)pFVar17)->super_Filtration_simplex_base).filt_;
  pFVar1 = &(this->interval_length_policy).min_length_;
  local_a4 = charac;
  local_84 = inv_x;
  local_70._32_8_ = a_ds;
  if (*pFVar1 <= fVar25 && fVar25 != *pFVar1) {
    local_70._0_8_ = pPVar2;
    std::
    vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
    ::
    emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int&>
              ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                *)&this->persistent_pairs_,
               (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                *)local_70,sigma,&local_a4);
  }
  p_Var16 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position._M_node = &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var14 = __position._M_node;
  if (p_Var16 != (_Base_ptr)0x0) {
    do {
      bVar24 = p_Var16[1]._M_color < death_key;
      if (!bVar24) {
        p_Var14 = p_Var16;
      }
      p_Var16 = (&p_Var16->_M_left)[bVar24];
    } while (p_Var16 != (_Base_ptr)0x0);
    if ((p_Var14 != __position._M_node) && (p_Var14[1]._M_color <= death_key)) {
      __position._M_node = p_Var14;
    }
  }
  local_80 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>,std::_Select1st<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
              *)&this->transverse_idx_;
  p_Var16 = *(_Base_ptr *)__position._M_node[1]._M_parent;
  local_a0.this = this;
  local_70._16_8_ = sigma;
  if (p_Var16 != __position._M_node[1]._M_parent) {
    local_48 = &this->coeff_field_;
    value = &this->cam_;
    local_98 = __position._M_node;
    local_70._24_8_ = value;
    do {
      if (p_Var16 == (_Base_ptr)0x0) {
        __function = 
        "static pointer boost::intrusive::bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>, boost::intrusive::list_node<void *> *, Gudhi::persistent_cohomology::cam_h_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistent_cohomology::cam_h_tag, Type = 1]"
        ;
LAB_00119d06:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,__function);
      }
      w = Field_Zp::times_minus(local_48,local_84,*(Element *)&p_Var16[1].field_0x4);
      if (w == 0) {
        p_Var16 = *(_Base_ptr *)p_Var16;
      }
      else {
        local_90 = *(_Base_ptr *)p_Var16;
        target = (Column *)p_Var16[1]._M_parent;
        this_00 = &target->col_;
        for (puVar3 = *(undefined8 **)
                       &(target->col_).super_type.data_.root_plus_size_.m_header.super_node;
            (Col_type *)puVar3 != this_00; puVar3 = (undefined8 *)*puVar3) {
          lVar4 = puVar3[-2];
          if (lVar4 != 0) {
            plVar5 = (long *)puVar3[-1];
            *plVar5 = lVar4;
            *(long **)(lVar4 + 8) = plVar5;
            puVar3[-2] = 0;
            puVar3[-1] = 0;
          }
        }
        local_78 = target;
        local_40 = target;
        boost::intrusive::
        bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
        ::erase((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                 *)local_70,(const_iterator *)value);
        aVar12.this = local_a0.this;
        plus_equal_column(local_a0.this,target,(A_ds_type *)local_70._32_8_,w);
        puVar6 = *(undefined1 **)
                  &(target->col_).super_type.data_.root_plus_size_.m_header.super_node;
        if ((Col_type *)puVar6 == this_00 || puVar6 == (undefined1 *)0x0) {
          ((aVar12.this)->ds_repr_).
          super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_start[target->class_key_] =
               (Persistent_cohomology_column<unsigned_int,_int> *)0x0;
          (target->
          super_set_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)0>_>).
          super_type.super_type.super_rbtree_node<void_*>.parent_ =
               ((aVar12.this)->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
               super_simple_segregated_storage<unsigned_long>.first;
          ((aVar12.this)->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
          super_simple_segregated_storage<unsigned_long>.first = target;
          p_Var16 = local_90;
          __position._M_node = local_98;
        }
        else {
          boost::intrusive::
          bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
          ::insert_unique((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                           *)local_70,(reference)value);
          this_01 = local_80;
          aVar12.this = local_a0.this;
          if (local_70[8] == '\x01') {
            for (plVar7 = (this_00->super_type).data_.root_plus_size_.m_header.super_node.next_;
                p_Var16 = local_90, __position._M_node = local_98, plVar7 != (node_ptr)this_00;
                plVar7 = plVar7->next_) {
              pmVar15 = std::
                        map<unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
                        ::operator[]((map<unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
                                      *)this_01,(key_type_conflict *)(plVar7 + 1));
              boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
              ::push_front(&pmVar15->row_->super_type,(reference)(plVar7 + 0xffffffffffffffff));
            }
          }
          else {
            if ((Persistent_cohomology_column<unsigned_int,_int> *)local_70._0_8_ ==
                (Persistent_cohomology_column<unsigned_int,_int> *)0x0) {
              __function = 
              "static pointer boost::intrusive::bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned int, int>, boost::intrusive::rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned int, int>, NodePtr = boost::intrusive::rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
              ;
              goto LAB_00119d06;
            }
            uVar18 = target->class_key_;
            uVar20 = (ulong)uVar18;
            puVar8 = ((local_a0.this)->dsets_).parent;
            uVar19 = puVar8[uVar20];
            uVar23 = uVar19;
            if (uVar19 != uVar18) {
              do {
                uVar18 = uVar23;
                uVar23 = puVar8[uVar18];
              } while (puVar8[uVar18] != uVar18);
            }
            uVar23 = ((pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                       *)(local_70._0_8_ + 0x30))->first;
            uVar21 = (ulong)uVar23;
            piVar9 = ((local_a0.this)->dsets_).rank;
            for (; uVar18 != uVar19; uVar19 = puVar8[uVar19]) {
              puVar8[uVar20] = uVar18;
              uVar20 = (ulong)uVar19;
            }
            uVar19 = puVar8[uVar21];
            uVar13 = uVar19;
            if (uVar19 != uVar23) {
              do {
                uVar23 = uVar13;
                uVar13 = puVar8[uVar23];
              } while (puVar8[uVar23] != uVar23);
            }
            for (; uVar23 != uVar19; uVar19 = puVar8[uVar19]) {
              puVar8[uVar21] = uVar23;
              uVar21 = (ulong)uVar19;
            }
            if (uVar18 != uVar23) {
              if (piVar9[uVar23] < piVar9[uVar18]) {
                puVar8[uVar23] = uVar18;
              }
              else {
                puVar8[uVar18] = uVar23;
                if (piVar9[uVar18] == piVar9[uVar23]) {
                  piVar9[uVar23] = piVar9[uVar18] + 1;
                }
              }
            }
            uVar21 = (ulong)target->class_key_;
            uVar18 = puVar8[uVar21];
            uVar20 = uVar21;
            uVar19 = uVar18;
            if (uVar18 != target->class_key_) {
              do {
                uVar20 = (ulong)uVar19;
                bVar24 = puVar8[uVar19] != uVar19;
                uVar19 = puVar8[uVar19];
              } while (bVar24);
            }
            for (; uVar19 = (uint)uVar20, uVar19 != uVar18; uVar18 = puVar8[uVar18]) {
              puVar8[uVar21] = uVar19;
              uVar21 = (ulong)uVar18;
            }
            ((local_a0.this)->ds_repr_).
            super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar20] =
                 (Persistent_cohomology_column<unsigned_int,_int> *)local_70._0_8_;
            ((pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)(local_70._0_8_ + 0x30))->first = uVar19;
            boost::intrusive::
            list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)0,Gudhi::persistent_cohomology::cam_v_tag,1u>,unsigned_long,false,void>
            ::
            clear_and_dispose<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::destroy_cocycle(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>const&,unsigned_int,int,int)::_lambda(Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>*)_1_>
                      (&this_00->super_type,local_a0);
            (local_78->
            super_set_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)0>_>).
            super_type.super_type.super_rbtree_node<void_*>.parent_ =
                 ((aVar12.this)->column_pool_).super_pool<boost::default_user_allocator_malloc_free>
                 .super_simple_segregated_storage<unsigned_long>.first;
            ((aVar12.this)->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
            super_simple_segregated_storage<unsigned_long>.first = local_78;
            p_Var16 = local_90;
            __position._M_node = local_98;
          }
        }
      }
    } while (p_Var16 != __position._M_node[1]._M_parent);
  }
  if (local_a4 == ((local_a0.this)->coeff_field_).Prime) {
    local_38 = *(node_ptr *)local_70._16_8_;
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::_to_node_it
              ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_70,
               (Simplex_handle *)(local_a0.this)->cpx_);
    (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
       *)(local_70._0_8_ + 8))->super_Key_simplex_base).key_ = 0xffffffff;
  }
  if (*(int *)&__position._M_node[1]._M_left == local_a4) {
    p_Var16 = __position._M_node[1]._M_parent;
    if (p_Var16 != (_Base_ptr)0x0) {
      p_Var11 = *(_Base_ptr *)p_Var16;
      while (p_Var11 != p_Var16) {
        p_Var10 = *(_Base_ptr *)p_Var11;
        *(undefined8 *)p_Var11 = 0;
        p_Var11->_M_parent = (_Base_ptr)0x0;
        p_Var11 = p_Var10;
      }
    }
    operator_delete(p_Var16,0x10);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>,std::_Select1st<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
    ::erase_abi_cxx11_(local_80,__position);
  }
  else {
    *(int *)&__position._M_node[1]._M_left = *(int *)&__position._M_node[1]._M_left / local_a4;
  }
  return;
}

Assistant:

void destroy_cocycle(Simplex_handle sigma, A_ds_type const& a_ds,
                       Simplex_key death_key, Arith_element inv_x,
                       Arith_element charac) {
    // Create a finite persistent interval for which the interval exists
    if (interval_length_policy(cpx_->simplex(death_key), sigma)) {
      persistent_pairs_.emplace_back(cpx_->simplex(death_key)  // creator
          , sigma                                              // destructor
          , charac);                                           // fields
    }

    auto death_key_row = transverse_idx_.find(death_key);  // Find the beginning of the row.
    std::pair<typename Cam::iterator, bool> result_insert_cam;

    auto row_cell_it = death_key_row->second.row_->begin();

    while (row_cell_it != death_key_row->second.row_->end()) {  // Traverse all cells in
      // the row at index death_key.
      Arith_element w = coeff_field_.times_minus(inv_x, row_cell_it->coefficient_);

      if (w != coeff_field_.additive_identity()) {
        Column * curr_col = row_cell_it->self_col_;
        ++row_cell_it;
        // Disconnect the column from the rows in the CAM.
        for (auto& col_cell : curr_col->col_) {
          col_cell.base_hook_cam_h::unlink();
        }

        // Remove the column from the CAM before modifying its value
        cam_.erase(cam_.iterator_to(*curr_col));
        // Proceed to the reduction of the column
        plus_equal_column(*curr_col, a_ds, w);

        if (curr_col->col_.empty()) {  // If the column is null
          ds_repr_[curr_col->class_key_] = NULL;
          column_pool_.destroy(curr_col);  // delete curr_col;
        } else {
          // Find whether the column obtained is already in the CAM
          result_insert_cam = cam_.insert(*curr_col);
          if (result_insert_cam.second) {  // If it was not in the CAM before: insertion has succeeded
            for (auto& col_cell : curr_col->col_) {
              // re-establish the row links
              transverse_idx_[col_cell.key_].row_->push_front(col_cell);
            }
          } else {  // There is already an identical column in the CAM:
            // merge two disjoint sets.
            dsets_.link(curr_col->class_key_,
                        result_insert_cam.first->class_key_);

            Simplex_key key_tmp = dsets_.find_set(curr_col->class_key_);
            ds_repr_[key_tmp] = &(*(result_insert_cam.first));
            result_insert_cam.first->class_key_ = key_tmp;
            // intrusive containers don't own their elements, we have to release them manually
            curr_col->col_.clear_and_dispose([&](Cell*p){cell_pool_.destroy(p);});
            column_pool_.destroy(curr_col);  // delete curr_col;
          }
        }
      } else {
        ++row_cell_it;
      }  // If w == 0, pass.
    }

    // Because it is a killer simplex, set the data of sigma to null_key().
    if (charac == coeff_field_.characteristic()) {
      cpx_->assign_key(sigma, cpx_->null_key());
    }
    if (death_key_row->second.characteristics_ == charac) {
      delete death_key_row->second.row_;
      transverse_idx_.erase(death_key_row);
    } else {
      death_key_row->second.characteristics_ /= charac;
    }
  }